

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int32_t roundAndPackInt32(flag zSign,uint64_t absZ,float_status *status)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    lVar2 = 0x40;
    break;
  case '\x01':
    lVar2 = 0x7f;
    if (zSign == '\0') {
      lVar2 = 0;
    }
    break;
  case '\x02':
    lVar2 = 0x7f;
    if (zSign != '\0') {
      lVar2 = 0;
    }
    break;
  case '\x03':
    lVar2 = 0;
    break;
  case '\x05':
    lVar2 = 0x7f;
    if ((char)(byte)absZ < '\0') {
      lVar2 = 0;
    }
    break;
  default:
    abort();
  }
  uVar3 = (uint)(lVar2 + absZ >> 7) &
          ~(uint)(((byte)absZ & 0x7f) == 0x40 && status->float_rounding_mode == '\0');
  uVar1 = -uVar3;
  if (zSign == '\0') {
    uVar1 = uVar3;
  }
  if ((lVar2 + absZ >> 0x27 == 0) && ((uVar1 == 0 || (uVar1 >> 0x1f == (uint)zSign)))) {
    if ((absZ & 0x7f) != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    return uVar1;
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return -0x80000000 - (uint)(zSign == '\0');
}

Assistant:

static int32_t roundAndPackInt32(flag zSign, uint64_t absZ, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven;
    int8_t roundIncrement, roundBits;
    int32_t z;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        roundIncrement = 0x40;
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : 0x7f;
        break;
    case float_round_down:
        roundIncrement = zSign ? 0x7f : 0;
        break;
    case float_round_to_odd:
        roundIncrement = absZ & 0x80 ? 0 : 0x7f;
        break;
    default:
        abort();
    }
    roundBits = absZ & 0x7F;
    absZ = ( absZ + roundIncrement )>>7;
    absZ &= ~ ( ( ( roundBits ^ 0x40 ) == 0 ) & roundNearestEven );
    z = absZ;
    if ( zSign ) z = - z;
    if ( ( absZ>>32 ) || ( z && ( ( z < 0 ) ^ zSign ) ) ) {
        float_raise(float_flag_invalid, status);
        return zSign ? INT32_MIN : INT32_MAX;
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}